

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

quint32 __thiscall QHostAddress::toIPv4Address(QHostAddress *this,bool *ok)

{
  char cVar1;
  QHostAddressPrivate *pQVar2;
  bool bVar3;
  long in_FS_OFFSET;
  quint32 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if (ok != (bool *)0x0) {
    cVar1 = pQVar2->protocol;
    bVar3 = true;
    if ((cVar1 != '\0') && (cVar1 != '\x02')) {
      if (cVar1 == '\x01') {
        bVar3 = convertToIpv4(&local_1c,&(pQVar2->field_1).a6,(ConversionMode)0x5);
      }
      else {
        bVar3 = false;
      }
    }
    *ok = bVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar2->a;
  }
  __stack_chk_fail();
}

Assistant:

quint32 QHostAddress::toIPv4Address(bool *ok) const
{
    quint32 dummy;
    if (ok)
        *ok = d->protocol == QHostAddress::IPv4Protocol || d->protocol == QHostAddress::AnyIPProtocol
              || (d->protocol == QHostAddress::IPv6Protocol
                  && convertToIpv4(dummy, d->a6, ConversionMode(QHostAddress::ConvertV4MappedToIPv4
                                                                | QHostAddress::ConvertUnspecifiedAddress)));
    return d->a;
}